

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transporter.cpp
# Opt level: O3

void __thiscall Transporter::Transporter(Transporter *this,bool server)

{
  uv_loop_t *puVar1;
  char *pcVar2;
  
  this->_vptr_Transporter = (_func_int **)&PTR__Transporter_0017f4d0;
  (this->thread)._M_id._M_thread = 0;
  this->receiveSize = 0;
  this->readHead = true;
  this->running = false;
  this->connected = false;
  this->serverMode = server;
  puVar1 = uv_loop_new();
  this->loop = puVar1;
  this->bufSize = 0x2800;
  pcVar2 = (char *)malloc(0x2800);
  this->buf = pcVar2;
  return;
}

Assistant:

Transporter::Transporter(bool server):
	receiveSize(0),
	readHead(true),
	running(false),
	connected(false),
	serverMode(server)
{
	loop = uv_loop_new();
	bufSize = 10 * 1024;
	buf = static_cast<char*>(malloc(bufSize));
}